

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

bool DLevelScript::DoCheckActorTexture(int tid,AActor *activator,int string,bool floor)

{
  double x;
  double y;
  double bottomz;
  AActor *pAVar1;
  char *texname;
  FTexture *pFVar2;
  FTextureID *pFVar3;
  FTexture *pFVar4;
  sector_t *resultsec;
  F3DFloor *resffloor;
  
  pAVar1 = SingleActorFromTID(tid,activator);
  if (pAVar1 != (AActor *)0x0) {
    texname = FBehavior::StaticLookupString(string);
    pFVar2 = FTextureManager::FindTexture(&TexMan,texname,2,0x23);
    if (pFVar2 != (FTexture *)0x0) {
      x = (pAVar1->__Pos).X;
      y = (pAVar1->__Pos).Y;
      bottomz = (pAVar1->__Pos).Z;
      if (floor) {
        sector_t::NextLowestFloorAt
                  (pAVar1->Sector,x,y,bottomz,0,pAVar1->MaxStepHeight,
                   (sector_t_conflict **)&resultsec,&resffloor);
        if (resffloor == (F3DFloor *)0x0) {
          pFVar3 = &resultsec->planes[0].Texture;
        }
        else {
          pFVar3 = (resffloor->top).texture;
        }
      }
      else {
        sector_t::NextHighestCeilingAt
                  (pAVar1->Sector,x,y,bottomz,pAVar1->Height + bottomz,0,
                   (sector_t_conflict **)&resultsec,&resffloor);
        if (resffloor == (F3DFloor *)0x0) {
          pFVar3 = &resultsec->planes[1].Texture;
        }
        else {
          pFVar3 = (resffloor->bottom).texture;
        }
      }
      if ((uint)pFVar3->texnum < TexMan.Textures.Count) {
        pFVar4 = TexMan.Textures.Array[pFVar3->texnum].Texture;
      }
      else {
        pFVar4 = (FTexture *)0x0;
      }
      return pFVar2 == pFVar4;
    }
  }
  return false;
}

Assistant:

bool DLevelScript::DoCheckActorTexture(int tid, AActor *activator, int string, bool floor)
{
	AActor *actor = SingleActorFromTID(tid, activator);
	if (actor == NULL)
	{
		return 0;
	}
	FTexture *tex = TexMan.FindTexture(FBehavior::StaticLookupString(string), FTexture::TEX_Flat,
			FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_TryAny|FTextureManager::TEXMAN_DontCreate);

	if (tex == NULL)
	{ // If the texture we want to check against doesn't exist, then
	  // they're obviously not the same.
		return 0;
	}
	FTextureID secpic;
	sector_t *resultsec;
	F3DFloor *resffloor;

	if (floor)
	{
		actor->Sector->NextLowestFloorAt(actor->X(), actor->Y(), actor->Z(), 0, actor->MaxStepHeight, &resultsec, &resffloor);
		secpic = resffloor ? *resffloor->top.texture : resultsec->planes[sector_t::floor].Texture;
	}
	else
	{
		actor->Sector->NextHighestCeilingAt(actor->X(), actor->Y(), actor->Z(), actor->Top(), 0, &resultsec, &resffloor);
		secpic = resffloor ? *resffloor->bottom.texture : resultsec->planes[sector_t::ceiling].Texture;
	}
	return tex == TexMan[secpic];
}